

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scsp.c
# Opt level: O0

void device_reset_scsp(void *info)

{
  int local_1c;
  int i;
  scsp_state *scsp;
  void *info_local;
  
  for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
    *(int *)((long)info + (long)local_1c * 0x98 + 0xe0) = local_1c;
    *(undefined1 *)((long)info + (long)local_1c * 0x98 + 0x71) = 0;
    *(undefined8 *)((long)info + (long)local_1c * 0x98 + 0x78) = 0;
    *(undefined4 *)((long)info + (long)local_1c * 0x98 + 0x90) = 3;
  }
  SCSPDSP_Init((SCSPDSP *)((long)info + 0x826a0));
  *(uint *)((long)info + 0x826a8) = *(uint *)((long)info + 0x1460) >> 1;
  *(undefined8 *)((long)info + 0x826a0) = *(undefined8 *)((long)info + 0x1458);
  return;
}

Assistant:

static void device_reset_scsp(void* info)
{
	scsp_state *scsp = (scsp_state *)info;
	int i;
	
	// make sure all the slots are off
	for(i=0;i<32;++i)
	{
		scsp->Slots[i].slot=i;
		scsp->Slots[i].active=0;
		scsp->Slots[i].base=NULL;
		scsp->Slots[i].EG.state=SCSP_RELEASE;
	}
	
	SCSPDSP_Init(&scsp->DSP);
	scsp->DSP.SCSPRAM_LENGTH = scsp->SCSPRAM_LENGTH / 2;
	scsp->DSP.SCSPRAM = (UINT16*)scsp->SCSPRAM;
	
	return;
}